

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* fmt::v10::
  make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string,char_const*,std::__cxx11::string>
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,char **args_1,
            basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2)

{
  longlong lVar1;
  size_t sVar2;
  size_t sVar3;
  longlong *in_RDX;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  bool formattable_2;
  bool formattable_pointer_2;
  bool formattable_char_2;
  bool formattable;
  bool formattable_pointer;
  bool formattable_char;
  bool formattable_1;
  bool formattable_pointer_1;
  bool formattable_char_1;
  undefined1 local_149;
  char *local_148;
  size_t local_140;
  undefined1 local_133;
  undefined1 local_132;
  undefined1 local_131;
  char *local_128 [3];
  undefined1 local_109;
  char *local_108;
  size_t local_100;
  undefined1 local_f3;
  undefined1 local_f2;
  undefined1 local_f1;
  char *local_e8 [2];
  undefined1 local_d4;
  undefined1 local_d3;
  undefined1 local_d2;
  undefined1 local_d1;
  undefined1 local_c8 [8];
  size_t local_c0;
  undefined1 *local_a8;
  basic_string_view<char> local_a0;
  undefined1 *local_88;
  basic_string_view<char> local_80;
  char **local_70;
  basic_string_view<char> local_68;
  char **local_58;
  basic_string_view<char> local_50;
  longlong local_40;
  undefined1 *local_38;
  longlong local_30;
  undefined1 *local_28;
  
  local_f1 = 1;
  local_f2 = 1;
  local_f3 = 1;
  local_a8 = &local_109;
  local_a0 = detail::to_string_view<char,std::char_traits<char>,std::allocator<char>>
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x29e14f);
  local_108 = local_a0.data_;
  local_100 = local_a0.size_;
  local_68.data_ = local_a0.data_;
  local_68.size_ = local_a0.size_;
  local_70 = local_e8;
  local_e8[0] = basic_string_view<char>::data(&local_68);
  sVar2 = basic_string_view<char>::size(&local_68);
  local_d1 = 1;
  local_d2 = 1;
  local_d3 = 1;
  lVar1 = *in_RDX;
  local_38 = &local_d4;
  local_28 = local_c8;
  local_131 = 1;
  local_132 = 1;
  local_133 = 1;
  local_88 = &local_149;
  local_40 = lVar1;
  local_30 = lVar1;
  local_80 = detail::to_string_view<char,std::char_traits<char>,std::allocator<char>>
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x29e2f6);
  local_148 = local_80.data_;
  local_140 = local_80.size_;
  local_50.data_ = local_80.data_;
  local_50.size_ = local_80.size_;
  local_58 = local_128;
  local_128[0] = basic_string_view<char>::data(&local_50);
  sVar3 = basic_string_view<char>::size(&local_50);
  (in_RDI->data_).args_[0].field_0.string.data = local_e8[0];
  (in_RDI->data_).args_[0].field_0.string.size = sVar2;
  (in_RDI->data_).args_[1].field_0.long_long_value = lVar1;
  (in_RDI->data_).args_[1].field_0.string.size = local_c0;
  (in_RDI->data_).args_[2].field_0.string.data = local_128[0];
  (in_RDI->data_).args_[2].field_0.string.size = sVar3;
  return in_RDI;
}

Assistant:

constexpr auto make_format_args(T&... args)
    -> format_arg_store<Context, remove_cvref_t<T>...> {
  return {args...};
}